

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O2

LY_ERR lyplg_type_validate_xpath10
                 (ly_ctx *UNUSED_ctx,lysc_type *UNUSED_type,lyd_node *ctx_node,lyd_node *UNUSED_tree
                 ,lyd_value *storage,ly_err_item **err)

{
  lysc_type_bitenum_item *plVar1;
  lysc_node *plVar2;
  ly_set *set_00;
  int iVar3;
  LY_ERR ecode;
  lysc_node **pplVar4;
  lyd_node *plVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 *object;
  ly_err_item *plVar8;
  lys_module *plVar9;
  ulong uVar10;
  ly_set *set;
  ly_err_item **local_48;
  lyd_node *local_40;
  lysc_type_bitenum_item *local_38;
  
  set = (ly_set *)0x0;
  *err = (ly_err_item *)0x0;
  plVar1 = (storage->field_2).enum_item;
  if (*(int *)&plVar1->exts != 6) {
    return LY_SUCCESS;
  }
  if (plVar1->ref == (char *)0x0) {
    __assert_fail("val->prefix_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                  ,0x184,
                  "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                 );
  }
  plVar2 = ctx_node->schema;
  pplVar4 = (lysc_node **)&plVar2->name;
  if (plVar2 == (lysc_node *)0x0) {
    pplVar4 = &ctx_node[1].schema;
  }
  local_40 = ctx_node;
  iVar3 = strcmp((char *)*pplVar4,"parent-reference");
  if ((iVar3 != 0) || (iVar3 = strcmp(plVar2->module->name,"ietf-yang-schema-mount"), iVar3 != 0)) {
    __assert_fail("!strcmp(LYD_NAME(ctx_node), \"parent-reference\") && !strcmp(ctx_node->schema->module->name, \"ietf-yang-schema-mount\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                  ,0x188,
                  "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                 );
  }
  ecode = lyd_find_xpath(local_40,"../../../namespace",&set);
  if (ecode == LY_SUCCESS) {
    uVar10 = 0;
    local_48 = err;
    local_38 = plVar1;
    while( true ) {
      if (set->count <= uVar10) {
        ly_set_free(set,(_func_void_void_ptr *)0x0);
        return LY_SUCCESS;
      }
      plVar5 = lyd_child((set->field_2).dnodes[uVar10]);
      pplVar4 = (lysc_node **)&plVar5->schema->name;
      if (plVar5->schema == (lysc_node *)0x0) {
        pplVar4 = &plVar5[1].schema;
      }
      iVar3 = strcmp((char *)*pplVar4,"prefix");
      if (iVar3 != 0) {
        __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), \"prefix\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                      ,400,
                      "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                     );
      }
      pcVar6 = lyd_get_value(plVar5);
      plVar5 = lyd_child((set->field_2).dnodes[uVar10]);
      plVar5 = plVar5->next;
      if (plVar5 != (lyd_node *)0x0) break;
LAB_001b4071:
      uVar10 = uVar10 + 1;
    }
    pplVar4 = (lysc_node **)&plVar5->schema->name;
    if (plVar5->schema == (lysc_node *)0x0) {
      pplVar4 = &plVar5[1].schema;
    }
    iVar3 = strcmp((char *)*pplVar4,"uri");
    if (iVar3 != 0) {
      __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), \"uri\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                    ,0x197,
                    "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                   );
    }
    pcVar7 = lyd_get_value(plVar5);
    set_00 = (ly_set *)local_38->ref;
    object = (undefined8 *)calloc(1,0x18);
    if (object != (undefined8 *)0x0) {
      pcVar6 = strdup(pcVar6);
      *object = pcVar6;
      pcVar7 = strdup(pcVar7);
      object[1] = pcVar7;
      ecode = LY_EMEM;
      if ((pcVar6 != (char *)0x0) && (pcVar7 != (char *)0x0)) {
        *(undefined4 *)(object + 2) = 1;
        ecode = ly_set_add(set_00,object,'\x01',(uint32_t *)0x0);
        if (ecode == LY_SUCCESS) goto LAB_001b4071;
        pcVar6 = (char *)*object;
      }
      free(pcVar6);
      free((void *)object[1]);
      free(object);
      err = local_48;
      goto LAB_001b40c0;
    }
    ly_set_free(set,(_func_void_void_ptr *)0x0);
    err = local_48;
  }
  else {
LAB_001b40c0:
    ly_set_free(set,(_func_void_void_ptr *)0x0);
    if (ecode != LY_EMEM) {
      if (local_40->schema == (lysc_node *)0x0) {
        plVar9 = (lys_module *)&local_40[2].schema;
      }
      else {
        plVar9 = local_40->schema->module;
      }
      plVar8 = ly_err_last(plVar9->ctx);
      pcVar6 = plVar8->data_path;
      pcVar7 = "%s";
      goto LAB_001b4126;
    }
  }
  pcVar7 = "Memory allocation failed.";
  ecode = LY_EMEM;
  pcVar6 = (char *)0x0;
LAB_001b4126:
  ly_err_new(err,ecode,LYVE_DATA,pcVar6,(char *)0x0,pcVar7);
  return ecode;
}

Assistant:

static LY_ERR
lyplg_type_validate_xpath10(const struct ly_ctx *UNUSED(ctx), const struct lysc_type *UNUSED(type),
        const struct lyd_node *ctx_node, const struct lyd_node *UNUSED(tree), struct lyd_value *storage,
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_value_xpath10 *val;
    struct ly_set *set = NULL;
    uint32_t i;
    const char *pref, *uri;
    const struct ly_err_item *eitem;

    *err = NULL;
    LYD_VALUE_GET(storage, val);

    if (val->format != LY_VALUE_STR_NS) {
        /* nothing to validate */
        return LY_SUCCESS;
    }

    /* the XML namespace set must exist */
    assert(val->prefix_data);

    /* special handling of this particular node */
    assert(!strcmp(LYD_NAME(ctx_node), "parent-reference") &&
            !strcmp(ctx_node->schema->module->name, "ietf-yang-schema-mount"));

    /* get all the prefix mappings */
    if ((ret = lyd_find_xpath(ctx_node, "../../../namespace", &set))) {
        goto cleanup;
    }

    for (i = 0; i < set->count; ++i) {
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), "prefix"));
        pref = lyd_get_value(lyd_child(set->dnodes[i]));

        if (!lyd_child(set->dnodes[i])->next) {
            /* missing URI - invalid mapping, skip */
            continue;
        }
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), "uri"));
        uri = lyd_get_value(lyd_child(set->dnodes[i])->next);

        /* new NS */
        if ((ret = xpath10_add_ns(val->prefix_data, pref, uri))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(set, NULL);
    if (ret == LY_EMEM) {
        ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, LY_EMEM_MSG);
    } else if (ret) {
        eitem = ly_err_last(LYD_CTX(ctx_node));
        ly_err_new(err, ret, LYVE_DATA, eitem->data_path, NULL, "%s", eitem->msg);
    }
    return ret;
}